

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Prepare(sqlite3 *db,char *zSql,int nBytes,u32 prepFlags,Vdbe *pReprepare,
                  sqlite3_stmt **ppStmt,char **pzTail)

{
  int *piVar1;
  VTable *pVVar2;
  Mem *p;
  Btree *pBVar3;
  u32 *puVar4;
  undefined8 uVar5;
  u8 uVar6;
  int iVar7;
  char *pcVar8;
  long lVar9;
  VTable *pVTab;
  long lVar10;
  ulong n;
  long in_FS_OFFSET;
  u32 local_1e4;
  undefined1 local_1e0 [240];
  undefined1 *puStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  Parse *local_d8;
  char *pcStack_d0;
  undefined1 *local_c8;
  undefined1 local_c0 [19];
  byte local_ad;
  Vdbe *local_90;
  char *local_88;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  local_d8 = (Parse *)&DAT_aaaaaaaaaaaaaaaa;
  pcStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
  local_e8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
  local_1e0._232_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_f0 = &DAT_aaaaaaaaaaaaaaaa;
  memset(local_1e0 + 8,0,0xe0);
  memset(local_c0,0,0x88);
  local_d8 = db->pParse;
  db->pParse = (Parse *)local_1e0;
  if (pReprepare != (Vdbe *)0x0) {
    local_ad = (byte)pReprepare->field_0xc8 >> 2 & 3;
    local_90 = pReprepare;
  }
  local_1e0._0_8_ = db;
  if (db->mallocFailed != '\0') {
    sqlite3ErrorMsg((Parse *)local_1e0,"out of memory");
    db->errCode = 7;
    iVar7 = 7;
    goto LAB_0015b842;
  }
  if ((prepFlags & 1) != 0) {
    local_1e0[0x24] = '\x01';
    (db->lookaside).bDisable = (db->lookaside).bDisable + 1;
    (db->lookaside).sz = 0;
  }
  uVar6 = (u8)prepFlags;
  local_1e0[0x25] = uVar6;
  if ((db->noSharedCache == '\0') && (iVar7 = db->nDb, 0 < iVar7)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      pBVar3 = *(Btree **)((long)&db->aDb->pBt + lVar10);
      if (pBVar3 != (Btree *)0x0) {
        if ((pBVar3->sharable != '\0') &&
           (pBVar3->wantToLock = pBVar3->wantToLock + 1, pBVar3->locked == '\0')) {
          btreeLockCarefully(pBVar3);
        }
        iVar7 = querySharedCacheTableLock(pBVar3,1,'\x01');
        if (pBVar3->sharable != '\0') {
          piVar1 = &pBVar3->wantToLock;
          *piVar1 = *piVar1 + -1;
          if (*piVar1 == 0) {
            unlockBtreeMutex(pBVar3);
          }
        }
        if (iVar7 != 0) {
          sqlite3ErrorWithMsg(db,iVar7,"database schema is locked: %s",
                              *(undefined8 *)((long)&db->aDb->zDbSName + lVar10));
          goto LAB_0015b842;
        }
        iVar7 = db->nDb;
      }
      lVar9 = lVar9 + 1;
      lVar10 = lVar10 + 0x20;
    } while (lVar9 < iVar7);
  }
  pVTab = db->pDisconnect;
  if (pVTab != (VTable *)0x0) {
    db->pDisconnect = (VTable *)0x0;
    do {
      pVVar2 = pVTab->pNext;
      sqlite3VtabUnlock(pVTab);
      pVTab = pVVar2;
    } while (pVVar2 != (VTable *)0x0);
  }
  if ((nBytes < 0) || ((n = (ulong)(uint)nBytes, nBytes != 0 && (zSql[n - 1] == '\0')))) {
    sqlite3RunParser((Parse *)local_1e0,zSql);
  }
  else {
    if (db->aLimit[1] < nBytes) {
      sqlite3ErrorWithMsg(db,0x12,"statement too long");
      iVar7 = apiHandleError(db,0x12);
      goto LAB_0015b842;
    }
    pcVar8 = sqlite3DbStrNDup(db,zSql,n);
    if (pcVar8 == (char *)0x0) {
      local_88 = zSql + n;
    }
    else {
      sqlite3RunParser((Parse *)local_1e0,pcVar8);
      local_88 = zSql + ((long)local_88 - (long)pcVar8);
      sqlite3DbFreeNN(db,pcVar8);
    }
  }
  uVar5 = local_1e0._16_8_;
  if (pzTail != (char **)0x0) {
    *pzTail = local_88;
  }
  if (((db->init).busy == '\0') && ((Vdbe *)local_1e0._16_8_ != (Vdbe *)0x0)) {
    *(u8 *)(local_1e0._16_8_ + 0xc6) = uVar6;
    if (-1 < (char)uVar6) {
      *(u32 *)(local_1e0._16_8_ + 0x11c) = 0;
    }
    pcVar8 = sqlite3DbStrNDup(*(sqlite3 **)local_1e0._16_8_,zSql,(long)((int)local_88 - (int)zSql));
    *(char **)(uVar5 + 0xf8) = pcVar8;
  }
  uVar5 = local_1e0._0_8_;
  if (db->mallocFailed == '\0') {
    if ((local_1e0._24_4_ != 0) && (local_1e0._24_4_ != 0x65)) {
      if ((local_1e0[0x1d] != '\0') &&
         (((db->init).busy == '\0' && (local_1e4 = 0xaaaaaaaa, 0 < *(int *)(local_1e0._0_8_ + 0x28))
          ))) {
        lVar9 = 0;
        lVar10 = 0;
        do {
          pBVar3 = *(Btree **)((long)&(*(Db **)(uVar5 + 0x20))->pBt + lVar9);
          if (pBVar3 != (Btree *)0x0) {
            uVar6 = pBVar3->inTrans;
            if ((uVar6 == '\0') && (iVar7 = btreeBeginTrans(pBVar3,0,(int *)0x0), iVar7 != 0)) {
              if ((iVar7 == 0xc0a) || (iVar7 == 7)) {
                sqlite3OomFault((sqlite3 *)uVar5);
                local_1e0._24_4_ = 7;
              }
              break;
            }
            sqlite3BtreeGetMeta(pBVar3,1,&local_1e4);
            puVar4 = *(u32 **)((long)&(*(Db **)(uVar5 + 0x20))->pSchema + lVar9);
            if (local_1e4 != *puVar4) {
              if ((*(byte *)((long)puVar4 + 0x72) & 1) != 0) {
                local_1e0._24_4_ = 0x11;
              }
              sqlite3ResetOneSchema((sqlite3 *)uVar5,(int)lVar10);
            }
            if (uVar6 == '\0') {
              sqlite3BtreeCommit(pBVar3);
            }
          }
          lVar10 = lVar10 + 1;
          lVar9 = lVar9 + 0x20;
        } while (lVar10 < *(int *)(uVar5 + 0x28));
      }
      goto LAB_0015b69b;
    }
    *ppStmt = (sqlite3_stmt *)local_1e0._16_8_;
    db->errCode = 0;
    db->errByteOffset = -1;
    p = db->pErr;
    iVar7 = 0;
    if (p != (Mem *)0x0) {
      if ((p->flags & 0x9000) == 0) {
        p->flags = 1;
      }
      else {
        vdbeMemClearExternAndSetNull(p);
      }
    }
  }
  else {
    local_1e0._24_4_ = 7;
    local_1e0[0x1d] = '\0';
LAB_0015b69b:
    if ((Vdbe *)local_1e0._16_8_ != (Vdbe *)0x0) {
      sqlite3VdbeFinalize((Vdbe *)local_1e0._16_8_);
    }
    iVar7 = local_1e0._24_4_;
    if ((TriggerPrg *)local_1e0._8_8_ == (TriggerPrg *)0x0) {
      sqlite3Error(db,local_1e0._24_4_);
    }
    else {
      sqlite3ErrorWithMsg(db,local_1e0._24_4_,"%s");
      if ((TriggerPrg *)local_1e0._8_8_ != (TriggerPrg *)0x0) goto LAB_0015b82d;
    }
  }
  while ((TriggerPrg *)local_1e0._192_8_ != (TriggerPrg *)0x0) {
    local_1e0._8_8_ = local_1e0._192_8_;
    local_1e0._192_8_ = *(TriggerPrg **)(local_1e0._192_8_ + 8);
LAB_0015b82d:
    sqlite3DbFreeNN(db,(void *)local_1e0._8_8_);
  }
LAB_0015b842:
  sqlite3ParseObjectReset((Parse *)local_1e0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar7;
}

Assistant:

static int sqlite3Prepare(
  sqlite3 *db,              /* Database handle. */
  const char *zSql,         /* UTF-8 encoded SQL statement. */
  int nBytes,               /* Length of zSql in bytes. */
  u32 prepFlags,            /* Zero or more SQLITE_PREPARE_* flags */
  Vdbe *pReprepare,         /* VM being reprepared */
  sqlite3_stmt **ppStmt,    /* OUT: A pointer to the prepared statement */
  const char **pzTail       /* OUT: End of parsed string */
){
  int rc = SQLITE_OK;       /* Result code */
  int i;                    /* Loop counter */
  Parse sParse;             /* Parsing context */

  /* sqlite3ParseObjectInit(&sParse, db); // inlined for performance */
  memset(PARSE_HDR(&sParse), 0, PARSE_HDR_SZ);
  memset(PARSE_TAIL(&sParse), 0, PARSE_TAIL_SZ);
  sParse.pOuterParse = db->pParse;
  db->pParse = &sParse;
  sParse.db = db;
  if( pReprepare ){
    sParse.pReprepare = pReprepare;
    sParse.explain = sqlite3_stmt_isexplain((sqlite3_stmt*)pReprepare);
  }else{
    assert( sParse.pReprepare==0 );
  }
  assert( ppStmt && *ppStmt==0 );
  if( db->mallocFailed ){
    sqlite3ErrorMsg(&sParse, "out of memory");
    db->errCode = rc = SQLITE_NOMEM;
    goto end_prepare;
  }
  assert( sqlite3_mutex_held(db->mutex) );

  /* For a long-term use prepared statement avoid the use of
  ** lookaside memory.
  */
  if( prepFlags & SQLITE_PREPARE_PERSISTENT ){
    sParse.disableLookaside++;
    DisableLookaside;
  }
  sParse.prepFlags = prepFlags & 0xff;

  /* Check to verify that it is possible to get a read lock on all
  ** database schemas.  The inability to get a read lock indicates that
  ** some other database connection is holding a write-lock, which in
  ** turn means that the other connection has made uncommitted changes
  ** to the schema.
  **
  ** Were we to proceed and prepare the statement against the uncommitted
  ** schema changes and if those schema changes are subsequently rolled
  ** back and different changes are made in their place, then when this
  ** prepared statement goes to run the schema cookie would fail to detect
  ** the schema change.  Disaster would follow.
  **
  ** This thread is currently holding mutexes on all Btrees (because
  ** of the sqlite3BtreeEnterAll() in sqlite3LockAndPrepare()) so it
  ** is not possible for another thread to start a new schema change
  ** while this routine is running.  Hence, we do not need to hold
  ** locks on the schema, we just need to make sure nobody else is
  ** holding them.
  **
  ** Note that setting READ_UNCOMMITTED overrides most lock detection,
  ** but it does *not* override schema lock detection, so this all still
  ** works even if READ_UNCOMMITTED is set.
  */
  if( !db->noSharedCache ){
    for(i=0; i<db->nDb; i++) {
      Btree *pBt = db->aDb[i].pBt;
      if( pBt ){
        assert( sqlite3BtreeHoldsMutex(pBt) );
        rc = sqlite3BtreeSchemaLocked(pBt);
        if( rc ){
          const char *zDb = db->aDb[i].zDbSName;
          sqlite3ErrorWithMsg(db, rc, "database schema is locked: %s", zDb);
          testcase( db->flags & SQLITE_ReadUncommit );
          goto end_prepare;
        }
      }
    }
  }

#ifndef SQLITE_OMIT_VIRTUALTABLE
  if( db->pDisconnect ) sqlite3VtabUnlockList(db);
#endif

  if( nBytes>=0 && (nBytes==0 || zSql[nBytes-1]!=0) ){
    char *zSqlCopy;
    int mxLen = db->aLimit[SQLITE_LIMIT_SQL_LENGTH];
    testcase( nBytes==mxLen );
    testcase( nBytes==mxLen+1 );
    if( nBytes>mxLen ){
      sqlite3ErrorWithMsg(db, SQLITE_TOOBIG, "statement too long");
      rc = sqlite3ApiExit(db, SQLITE_TOOBIG);
      goto end_prepare;
    }
    zSqlCopy = sqlite3DbStrNDup(db, zSql, nBytes);
    if( zSqlCopy ){
      sqlite3RunParser(&sParse, zSqlCopy);
      sParse.zTail = &zSql[sParse.zTail-zSqlCopy];
      sqlite3DbFree(db, zSqlCopy);
    }else{
      sParse.zTail = &zSql[nBytes];
    }
  }else{
    sqlite3RunParser(&sParse, zSql);
  }
  assert( 0==sParse.nQueryLoop );

  if( pzTail ){
    *pzTail = sParse.zTail;
  }

  if( db->init.busy==0 ){
    sqlite3VdbeSetSql(sParse.pVdbe, zSql, (int)(sParse.zTail-zSql), prepFlags);
  }
  if( db->mallocFailed ){
    sParse.rc = SQLITE_NOMEM_BKPT;
    sParse.checkSchema = 0;
  }
  if( sParse.rc!=SQLITE_OK && sParse.rc!=SQLITE_DONE ){
    if( sParse.checkSchema && db->init.busy==0 ){
      schemaIsValid(&sParse);
    }
    if( sParse.pVdbe ){
      sqlite3VdbeFinalize(sParse.pVdbe);
    }
    assert( 0==(*ppStmt) );
    rc = sParse.rc;
    if( sParse.zErrMsg ){
      sqlite3ErrorWithMsg(db, rc, "%s", sParse.zErrMsg);
      sqlite3DbFree(db, sParse.zErrMsg);
    }else{
      sqlite3Error(db, rc);
    }
  }else{
    assert( sParse.zErrMsg==0 );
    *ppStmt = (sqlite3_stmt*)sParse.pVdbe;
    rc = SQLITE_OK;
    sqlite3ErrorClear(db);
  }


  /* Delete any TriggerPrg structures allocated while parsing this statement. */
  while( sParse.pTriggerPrg ){
    TriggerPrg *pT = sParse.pTriggerPrg;
    sParse.pTriggerPrg = pT->pNext;
    sqlite3DbFree(db, pT);
  }

end_prepare:

  sqlite3ParseObjectReset(&sParse);
  return rc;
}